

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O0

void __thiscall
bgui::FileImageWindow::onKey(FileImageWindow *this,char c,SpecialKey key,int x,int y)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  char *__new;
  long lVar4;
  ostream *poVar5;
  reference pvVar6;
  char *pcVar7;
  undefined4 in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  Properties *in_stack_00000010;
  IOException *anon_var_0;
  ostringstream out;
  long hp;
  long wp;
  long yp;
  long xp;
  Properties prop;
  string name;
  undefined4 in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  BaseWindow *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcc0;
  const_iterator in_stack_fffffffffffffcc8;
  char *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffcf8;
  undefined2 uVar8;
  bool top;
  uint in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  BaseWindow *in_stack_fffffffffffffd08;
  BaseWindow *this_00;
  BaseWindow *in_stack_fffffffffffffd70;
  string local_270 [16];
  long *in_stack_fffffffffffffda0;
  long *in_stack_fffffffffffffda8;
  long *in_stack_fffffffffffffdb0;
  long *in_stack_fffffffffffffdb8;
  ImageWindow *in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffe4b;
  int in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  uint *in_stack_fffffffffffffe58;
  FileImageWindow *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe88;
  FileImageWindow *in_stack_fffffffffffffe90;
  FileImageWindow *in_stack_ffffffffffffff10;
  long local_d8;
  long local_d0;
  long local_c8;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  SpecialKey in_stack_ffffffffffffff48;
  char in_stack_ffffffffffffff4f;
  ImageWindow *in_stack_ffffffffffffff50;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  BaseWindow local_38 [2];
  undefined1 local_9;
  undefined1 verbose;
  
  uVar8 = (undefined2)((ulong)in_stack_fffffffffffffcf8 >> 0x30);
  local_9 = in_SIL;
  lVar4 = in_RDI;
  switch(in_EDX) {
  case 2:
    if (*(int *)(in_RDI + 0x90) != 0) {
      *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + -1;
      load(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57,
           in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,(bool)in_stack_fffffffffffffe4b);
    }
    BaseWindow::setInfoLine
              (in_stack_fffffffffffffd08,
               (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0));
    break;
  case 3:
    *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + 1;
    uVar1 = *(uint *)(in_RDI + 0x90);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x78));
    if (uVar1 < sVar3) {
      load(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57,
           in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,(bool)in_stack_fffffffffffffe4b);
    }
    else {
      *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + -1;
    }
    BaseWindow::setInfoLine
              (in_stack_fffffffffffffd08,
               (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0));
    break;
  default:
    break;
  case 6:
    if (*(int *)(in_RDI + 0x90) != 0) {
      *(undefined4 *)(in_RDI + 0x90) = 0;
      load(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57,
           in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,(bool)in_stack_fffffffffffffe4b);
    }
    BaseWindow::setInfoLine
              (in_stack_fffffffffffffd08,
               (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0));
    break;
  case 7:
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x78));
    if (sVar3 != 0) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x78));
      *(int *)(in_RDI + 0x90) = (int)sVar3 + -1;
      load(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57,
           in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,(bool)in_stack_fffffffffffffe4b);
    }
    BaseWindow::setInfoLine
              (in_stack_fffffffffffffd08,
               (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0));
  }
  verbose = (undefined1)((ulong)lVar4 >> 0x38);
  switch(local_9) {
  case 99:
    uVar1 = *(uint *)(in_RDI + 0x90);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x78));
    if (uVar1 < sVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x78),(ulong)*(uint *)(in_RDI + 0x90));
      std::__cxx11::string::c_str();
      saveContent(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    break;
  case 100:
    uVar1 = *(uint *)(in_RDI + 0x90);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x78));
    if (uVar1 < sVar3) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RDI + 0x78),(ulong)*(uint *)(in_RDI + 0x90));
      std::__cxx11::string::string((string *)local_38,(string *)pvVar6);
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                             (difference_type)in_stack_fffffffffffffcb0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffcb0,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::erase(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8);
      if ((*(int *)(in_RDI + 0x90) != 0) &&
         (uVar1 = *(uint *)(in_RDI + 0x90),
         sVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(in_RDI + 0x78)), sVar3 <= uVar1)) {
        *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + -1;
      }
      load(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57,
           in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,(bool)in_stack_fffffffffffffe4b);
      this_00 = local_38;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      __new = (char *)std::__cxx11::string::c_str();
      iVar2 = rename(pcVar7,__new);
      std::__cxx11::string::~string(local_88);
      top = SUB21((ushort)uVar8 >> 8,0);
      if (iVar2 == 0) {
        BaseWindow::setInfoLine(this_00,(char *)(ulong)in_stack_fffffffffffffd00,top,SUB21(uVar8,0))
        ;
      }
      else {
        BaseWindow::setInfoLine
                  (this_00,(char *)CONCAT44(iVar2,in_stack_fffffffffffffd00),top,SUB21(uVar8,0));
      }
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x78));
      if (sVar3 == 0) {
        BaseWindow::sendClose(in_stack_fffffffffffffd70);
      }
      std::__cxx11::string::~string((string *)local_38);
    }
    break;
  case 0x6b:
    iVar2 = *(int *)(in_RDI + 0xc0);
    if (iVar2 == 0) {
      *(undefined4 *)(in_RDI + 0xc0) = 1;
    }
    else if (iVar2 == 1) {
      *(undefined4 *)(in_RDI + 0xc0) = 2;
    }
    else if (iVar2 == 2) {
      *(undefined4 *)(in_RDI + 0xc0) = 0;
    }
    updateTitle(in_stack_ffffffffffffff10);
    break;
  case 0x70:
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      gutil::Properties::Properties((Properties *)0x141dfe);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x78),(ulong)*(uint *)(in_RDI + 0x90));
      std::__cxx11::string::c_str();
      getenv("CVKIT_SPATH");
      gimage::loadViewProperties(in_stack_00000010,in_stack_00000008,unaff_retaddr,(bool)verbose);
      ImageWindow::visibleImagePart
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdb0);
      poVar5 = std::operator<<((ostream *)&stack0xfffffffffffffdb0,"\"");
      poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 0x58));
      std::operator<<(poVar5,"\" \"");
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RDI + 0x78),(ulong)*(uint *)(in_RDI + 0x90));
      std::operator<<((ostream *)&stack0xfffffffffffffdb0,(string *)pvVar6);
      poVar5 = std::operator<<((ostream *)&stack0xfffffffffffffdb0,",x=");
      std::ostream::operator<<(poVar5,CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
      ;
      poVar5 = std::operator<<((ostream *)&stack0xfffffffffffffdb0,",y=");
      std::ostream::operator<<(poVar5,local_c8);
      poVar5 = std::operator<<((ostream *)&stack0xfffffffffffffdb0,",w=");
      std::ostream::operator<<(poVar5,local_d0);
      poVar5 = std::operator<<((ostream *)&stack0xfffffffffffffdb0,",h=");
      std::ostream::operator<<(poVar5,local_d8);
      std::operator<<((ostream *)&stack0xfffffffffffffdb0,"\"");
      std::operator<<((ostream *)&stack0xfffffffffffffdb0," &");
      std::__cxx11::ostringstream::str();
      poVar5 = std::operator<<((ostream *)&std::cout,local_270);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iVar2 = system(pcVar7);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
      if (iVar2 == -1) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Failed!");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffdb0);
      gutil::Properties::~Properties((Properties *)0x142165);
    }
    break;
  case 0x75:
    *(byte *)(in_RDI + 0xcc) = (*(byte *)(in_RDI + 0xcc) ^ 0xff) & 1;
    if ((*(byte *)(in_RDI + 0xcc) & 1) == 0) {
      BaseWindow::removeFileWatch(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      updateTitle(in_stack_ffffffffffffff10);
    }
    else {
      load(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57,
           in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,(bool)in_stack_fffffffffffffe4b);
    }
  }
  ImageWindow::onKey(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
  return;
}

Assistant:

void FileImageWindow::onKey(char c, SpecialKey key, int x, int y)
{
  switch (key)
  {
    case k_home: /* load first image */
      if (current > 0)
      {
        current=0;
        load(current, false);
      }

      setInfoLine("");
      break;

    case k_end: /* load last image */
      if (list.size() > 0)
      {
        current=static_cast<unsigned int>(list.size()-1);
        load(current, true);
      }

      setInfoLine("");
      break;

    case k_left: /* load previous image */
      if (current > 0)
      {
        current--;
        load(current, false);
      }

      setInfoLine("");
      break;

    case k_right: /* load next image */
      current++;

      if (current < list.size())
      {
        load(current, true);
      }
      else
      {
        current--;
      }

      setInfoLine("");
      break;

    default:
      break;
  }

  switch (c)
  {
    case 'u': /* update image and toggle watch flag */
#ifdef INCLUDE_INOTIFY
      watch_file=!watch_file;

      if (watch_file)
      {
        load(current, true);
      }
      else
      {
        removeFileWatch(wid);
        updateTitle();
      }

#else
      load(current, true);
#endif
      break;

    case 'k':
      switch (kp)
      {
        case keep_none:
          kp=keep_most;
          break;

        case keep_most:
          kp=keep_all;
          break;

        case keep_all:
          kp=keep_none;
          break;
      }

      updateTitle();
      break;

    case 'c':
      if (current < list.size())
      {
        saveContent(list[current].c_str());
      }

      break;

    case 'd':
      if (current < list.size())
      {
        std::string name=list[current];

        list.erase(list.begin()+current);

        if (current > 0 && current >= list.size())
        {
          current--;
        }

        load(current, true);

        if (rename(name.c_str(), (name+".bak").c_str()) != 0)
        {
          setInfoLine("Cannot remove image file!");
        }
        else
        {
          setInfoLine("");
        }

        if (list.size() == 0)
        {
          sendClose();
        }
      }

      break;

    case 'p':
      if (vc.size() > 0)
      {
        try
        {
          gutil::Properties prop;
          gimage::loadViewProperties(prop, list[current].c_str(), getenv("CVKIT_SPATH"), false);

          long xp, yp, wp, hp;
          visibleImagePart(xp, yp, wp, hp);

          std::ostringstream out;

#ifdef WIN32
          out << "start \"plyv\" ";
#endif
          out << "\"" << vc << "\" \"";
          out << list[current];
          out << ",x=" << xp;
          out << ",y=" << yp;
          out << ",w=" << wp;
          out << ",h=" << hp;
          out << "\"";
#ifndef WIN32
          out << " &";
#endif
          std::cout << out.str() << std::endl;
		  
          if (system(out.str().c_str()) == -1)
          {
            std::cout << "Failed!" << std::endl;
          }
        }
        catch (const gutil::IOException &)
        {
          setInfoLine("Missing disparity parameter file!");
        }
      }

      break;
  }

  ImageWindow::onKey(c, key, x, y);
}